

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uscript.cpp
# Opt level: O1

int32_t getCodesFromLocale(char *locale,UScriptCode *scripts,int32_t capacity,UErrorCode *err)

{
  int32_t iVar1;
  UScriptCode UVar2;
  long lVar3;
  UScriptCode UVar4;
  int32_t iVar5;
  char lang [8];
  UErrorCode internalErrorCode;
  char script [8];
  short local_44;
  char local_42;
  UErrorCode local_3c;
  int local_38;
  char local_34;
  
  local_3c = U_ZERO_ERROR;
  iVar5 = 0;
  iVar1 = 0;
  if ((*err < U_ILLEGAL_ARGUMENT_ERROR) &&
     (uloc_getLanguage_63(locale,(char *)&local_44,8,&local_3c), iVar1 = iVar5,
     local_3c != U_STRING_NOT_TERMINATED_WARNING && local_3c < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (local_42 == '\0' && local_44 == 0x616a) {
      iVar1 = 0;
      if (*err < U_ILLEGAL_ARGUMENT_ERROR) {
        if (capacity < 3) {
          *err = U_BUFFER_OVERFLOW_ERROR;
          iVar1 = 3;
        }
        else {
          lVar3 = 0;
          iVar1 = 3;
          do {
            *(undefined4 *)((long)scripts + lVar3) = *(undefined4 *)((long)JAPANESE + lVar3);
            lVar3 = lVar3 + 4;
          } while (lVar3 != 0xc);
        }
      }
    }
    else {
      if (local_42 == '\0' && local_44 == 0x6f6b) {
        if (U_ZERO_ERROR < *err) {
          return 0;
        }
        if (1 < capacity) {
          lVar3 = 0;
          do {
            *(undefined4 *)((long)scripts + lVar3) = *(undefined4 *)((long)KOREAN + lVar3);
            lVar3 = lVar3 + 4;
          } while (lVar3 != 8);
          return 2;
        }
      }
      else {
        iVar1 = uloc_getScript_63(locale,(char *)&local_38,8,&local_3c);
        if (local_3c == U_STRING_NOT_TERMINATED_WARNING || U_ZERO_ERROR < local_3c) {
          return 0;
        }
        if ((local_42 != '\0' || local_44 != 0x687a) || (local_34 != '\0' || local_38 != 0x746e6148)
           ) {
          if (iVar1 != 0) {
            UVar2 = u_getPropertyValueEnum_63(UCHAR_SCRIPT,(char *)&local_38);
            if (UVar2 != USCRIPT_INVALID_CODE) {
              UVar4 = USCRIPT_HAN;
              if (1 < (uint)(UVar2 + ~USCRIPT_KHUTSURI)) {
                UVar4 = UVar2;
              }
              iVar5 = 0;
              if (*err < U_ILLEGAL_ARGUMENT_ERROR) {
                if (capacity < 1) {
                  *err = U_BUFFER_OVERFLOW_ERROR;
                }
                else {
                  *scripts = UVar4;
                }
                iVar5 = 1;
              }
            }
            if (UVar2 != USCRIPT_INVALID_CODE) {
              return iVar5;
            }
          }
          return 0;
        }
        if (U_ZERO_ERROR < *err) {
          return 0;
        }
        if (1 < capacity) {
          lVar3 = 0;
          do {
            *(undefined4 *)((long)scripts + lVar3) = *(undefined4 *)((long)HAN_BOPO + lVar3);
            lVar3 = lVar3 + 4;
          } while (lVar3 != 8);
          return 2;
        }
      }
      *err = U_BUFFER_OVERFLOW_ERROR;
      iVar1 = 2;
    }
  }
  return iVar1;
}

Assistant:

static int32_t
getCodesFromLocale(const char *locale,
                   UScriptCode *scripts, int32_t capacity, UErrorCode *err) {
    UErrorCode internalErrorCode = U_ZERO_ERROR;
    char lang[8];
    char script[8];
    int32_t scriptLength;
    if(U_FAILURE(*err)) { return 0; }
    // Multi-script languages, equivalent to the LocaleScript data
    // that we used to load from locale resource bundles.
    /*length = */ uloc_getLanguage(locale, lang, UPRV_LENGTHOF(lang), &internalErrorCode);
    if(U_FAILURE(internalErrorCode) || internalErrorCode == U_STRING_NOT_TERMINATED_WARNING) {
        return 0;
    }
    if(0 == uprv_strcmp(lang, "ja")) {
        return setCodes(JAPANESE, UPRV_LENGTHOF(JAPANESE), scripts, capacity, err);
    }
    if(0 == uprv_strcmp(lang, "ko")) {
        return setCodes(KOREAN, UPRV_LENGTHOF(KOREAN), scripts, capacity, err);
    }
    scriptLength = uloc_getScript(locale, script, UPRV_LENGTHOF(script), &internalErrorCode);
    if(U_FAILURE(internalErrorCode) || internalErrorCode == U_STRING_NOT_TERMINATED_WARNING) {
        return 0;
    }
    if(0 == uprv_strcmp(lang, "zh") && 0 == uprv_strcmp(script, "Hant")) {
        return setCodes(HAN_BOPO, UPRV_LENGTHOF(HAN_BOPO), scripts, capacity, err);
    }
    // Explicit script code.
    if(scriptLength != 0) {
        UScriptCode scriptCode = (UScriptCode)u_getPropertyValueEnum(UCHAR_SCRIPT, script);
        if(scriptCode != USCRIPT_INVALID_CODE) {
            if(scriptCode == USCRIPT_SIMPLIFIED_HAN || scriptCode == USCRIPT_TRADITIONAL_HAN) {
                scriptCode = USCRIPT_HAN;
            }
            return setOneCode(scriptCode, scripts, capacity, err);
        }
    }
    return 0;
}